

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

string * __thiscall
iutest::detail::ElementsAreMatcherBase::
WhichIsElem<0,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
          (string *__return_storage_ptr__,ElementsAreMatcherBase *this,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
          *matchers,int index)

{
  ostream *poVar1;
  __tuple_element_t<0UL,_tuple<GeMatcher<int>,_GtMatcher<int>,_NeMatcher<int>,_EqMatcher<int>_>_> *m
  ;
  undefined1 local_1a8 [8];
  iu_global_format_stringstream strm;
  int index_local;
  tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
  *matchers_local;
  
  strm.super_iu_stringstream._388_4_ = SUB84(matchers,0);
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  poVar1 = std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8,"ElementsAre(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,strm.super_iu_stringstream._388_4_);
  poVar1 = std::operator<<(poVar1,"): ");
  m = std::
      get<0ul,iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>
                ((tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
                  *)this);
  detail::operator<<(poVar1,m);
  std::__cxx11::stringstream::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string WhichIsElem(const T& matchers, int index)
    {
        iu_global_format_stringstream strm;
        strm << "ElementsAre(" << index << "): " << tuples::get<N>(matchers);
        return strm.str();
    }